

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcProcess::~IfcProcess(IfcProcess *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcObject.field_0x28 = 0x901178;
  *(undefined8 *)&(this->super_IfcObject).field_0x10 = 0x9011f0;
  *(undefined8 *)
   &this[-1].super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18
       = 0x9011a0;
  *(undefined8 *)&this[-1].super_IfcObject.field_0xc0 = 0x9011c8;
  puVar1 = *(undefined1 **)&this[-1].super_IfcObject.field_0xd0;
  if (puVar1 != &this[-1].super_IfcObject.field_0xe0) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&this[-1].super_IfcObject.field_0x28 = 0x901290;
  *(undefined8 *)&(this->super_IfcObject).field_0x10 = 0x9012b8;
  puVar1 = *(undefined1 **)&this[-1].super_IfcObject.field_0x88;
  if ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> *)puVar1 !=
      &this[-1].super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcObject.field_0x60;
  if (puVar1 != &this[-1].super_IfcObject.field_0x70) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcObject.field_0x38;
  if (puVar1 != &this[-1].super_IfcObject.field_0x48) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcObject.field_0x28);
  return;
}

Assistant:

IfcProcess() : Object("IfcProcess") {}